

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::ValidateThreadContext(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  Type pTVar3;
  undefined4 *puVar4;
  
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  for (pTVar3 = globalListFirst; pTVar3 != (ThreadContext *)0x0;
      pTVar3 = (pTVar3->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).next)
  {
    if (pTVar3 == this) goto LAB_007b8dfd;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                     ,0x27b,"(found)","invalid thread context");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_007b8dfd:
  CCLock::Leave(&s_csThreadContext.super_CCLock);
  return;
}

Assistant:

void ThreadContext::ValidateThreadContext()
    {
#if DBG
    // verify the runtime pointer is valid.
        {
            BOOL found = FALSE;
            AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
            ThreadContext* currentThreadContext = GetThreadContextList();
            while (currentThreadContext)
            {
                if (currentThreadContext == this)
                {
                    return;
                }
                currentThreadContext = currentThreadContext->Next();
            }
            AssertMsg(found, "invalid thread context");
        }

#endif
}